

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::crate::CrateReader::GetSpecString_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CrateReader *this,Index index)

{
  bool bVar1;
  size_type sVar2;
  string *psVar3;
  SpecType ty;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string specty_str;
  string path_str;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_58 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pathv;
  Spec *spec;
  CrateReader *this_local;
  Index index_local;
  
  sVar2 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::size
                    (&this->_specs);
  if (index.value < sVar2) {
    pathv.contained._24_8_ =
         ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::operator[]
                   (&this->_specs,(ulong)index.value);
    GetPathString_abi_cxx11_
              (&local_80,this,(Index)(((const_reference)pathv.contained._24_8_)->path_index).value);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_58,&local_80);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional(&local_80);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_58);
    if (bVar1) {
      psVar3 = (string *)
               nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_58);
      ::std::__cxx11::string::string((string *)(specty_str.field_2._M_local_buf + 8),psVar3);
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_c8,(tinyusdz *)(ulong)*(uint *)(pathv.contained._24_8_ + 8),ty);
      ::std::operator+(&local_168,"[Spec] path: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&specty_str.field_2 + 8));
      ::std::operator+(&local_148,&local_168,", fieldset id: ");
      ::std::__cxx11::to_string(&local_188,*(uint *)(pathv.contained._24_8_ + 4));
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_148);
      ::std::operator+(&local_108,&local_128,", spec_type: ");
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_108);
      nonstd::optional_lite::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,&local_e8);
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::__cxx11::string::~string((string *)&local_128);
      ::std::__cxx11::string::~string((string *)&local_188);
      ::std::__cxx11::string::~string((string *)&local_148);
      ::std::__cxx11::string::~string((string *)&local_168);
      ::std::__cxx11::string::~string((string *)local_c8);
      ::std::__cxx11::string::~string((string *)(specty_str.field_2._M_local_buf + 8));
    }
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_58);
    if (!bVar1) {
      nonstd::optional_lite::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(__return_storage_ptr__);
    }
  }
  else {
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::string> CrateReader::GetSpecString(
    crate::Index index) const {
  if (index.value < _specs.size()) {
    // ok
  } else {
    return nonstd::nullopt;
  }

  const crate::Spec &spec = _specs[index.value];

  if (auto pathv = GetPathString(spec.path_index)) {
    std::string path_str = pathv.value();
    std::string specty_str = to_string(spec.spec_type);

    return "[Spec] path: " + path_str +
           ", fieldset id: " + std::to_string(spec.fieldset_index.value) +
           ", spec_type: " + specty_str;
  }

  return nonstd::nullopt;
}